

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rtreeInit(sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVtab,char **pzErr,
             int isCreate)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  Rtree *pRtree;
  sqlite3_str *p;
  char *pcVar8;
  ulong uVar9;
  u64 n;
  uchar *puVar10;
  long in_FS_OFFSET;
  bool bVar11;
  bool bVar12;
  int dummy;
  char *aErrMsg [5];
  int local_6c;
  char *local_68 [4];
  char *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68[0] = (char *)0x0;
  local_68[1] = "Wrong number of columns for an rtree table";
  local_68[2] = "Too few columns for an rtree table";
  local_68[3] = "Too many columns for an rtree table";
  local_48 = "Auxiliary rtree columns must be last";
  if (argc - 0x68U < 0xffffff9e) {
    pcVar5 = sqlite3_mprintf("%s",local_68[(ulong)(5 < argc) + 2]);
    *pzErr = pcVar5;
    iVar4 = 1;
  }
  else {
    sqlite3_vtab_config(db,1,1);
    sqlite3_vtab_config(db,2);
    sVar6 = strlen(argv[1]);
    sVar7 = strlen(argv[2]);
    iVar4 = (int)sVar7;
    n = (long)(int)sVar6 + (long)(iVar4 * 2) + 0x3d0;
    iVar2 = sqlite3_initialize();
    if (iVar2 == 0) {
      pRtree = (Rtree *)sqlite3Malloc(n);
    }
    else {
      pRtree = (Rtree *)0x0;
    }
    if (pRtree != (Rtree *)0x0) {
      memset(pRtree,0,n);
      pcVar5 = (char *)((long)&pRtree[1].base.pModule +
                       ((long)((sVar6 << 0x20) + 0x100000000) >> 0x20));
      pRtree->nBusy = 1;
      (pRtree->base).pModule = &rtreeModule;
      pRtree->zDb = (char *)(pRtree + 1);
      pRtree->zName = pcVar5;
      pRtree->zNodeName = pcVar5 + (iVar4 + 1);
      pRtree->eCoordType = pAux != (void *)0x0;
      memcpy(pRtree + 1,argv[1],(long)(int)sVar6);
      sVar6 = (size_t)iVar4;
      memcpy(pcVar5,argv[2],sVar6);
      memcpy(pRtree->zNodeName,argv[2],sVar6);
      builtin_strncpy(pRtree->zNodeName + sVar6,"_node",6);
      p = sqlite3_str_new(db);
      puVar10 = (uchar *)argv[3];
      local_6c = 0;
      uVar3 = sqlite3GetToken(puVar10,&local_6c);
      sqlite3_str_appendf(p,"CREATE TABLE x(%.*s INT",(ulong)uVar3,puVar10);
      bVar11 = 4 < argc;
      if (4 < argc) {
        uVar9 = 5;
        do {
          puVar10 = (uchar *)argv[uVar9 - 1];
          if (*puVar10 == '+') {
            pRtree->nAux = pRtree->nAux + '\x01';
            puVar10 = puVar10 + 1;
            local_6c = 0;
            uVar3 = sqlite3GetToken(puVar10,&local_6c);
            pcVar5 = ",%.*s";
          }
          else {
            if (pRtree->nAux != '\0') break;
            pRtree->nDim2 = pRtree->nDim2 + '\x01';
            pcVar5 = (char *)((long)&rtreeInit_azFormat_rel +
                             (long)*(int *)((long)&rtreeInit_azFormat_rel +
                                           (ulong)(pAux != (void *)0x0) * 4));
            local_6c = 0;
            uVar3 = sqlite3GetToken(puVar10,&local_6c);
          }
          sqlite3_str_appendf(p,pcVar5,(ulong)uVar3,puVar10);
          bVar11 = uVar9 < (uint)argc;
          bVar12 = uVar9 != (uint)argc;
          uVar9 = uVar9 + 1;
        } while (bVar12);
      }
      sqlite3_str_appendf(p,");");
      pcVar5 = sqlite3_str_finish(p);
      if (pcVar5 == (char *)0x0) {
        iVar4 = 7;
      }
      else {
        if (bVar11) {
          pcVar8 = sqlite3_mprintf("%s","Auxiliary rtree columns must be last");
          iVar4 = 1;
        }
        else {
          iVar4 = sqlite3_declare_vtab(db,pcVar5);
          if (iVar4 == 0) {
            iVar4 = 0;
            goto LAB_001f9ad5;
          }
          pcVar8 = sqlite3_errmsg(db);
          pcVar8 = sqlite3_mprintf("%s",pcVar8);
        }
        *pzErr = pcVar8;
      }
LAB_001f9ad5:
      sqlite3_free(pcVar5);
      if (iVar4 == 0) {
        bVar1 = pRtree->nDim2;
        pRtree->nDim = bVar1 >> 1;
        if (bVar1 < 2) {
          uVar9 = 2;
LAB_001f9b07:
          bVar11 = false;
        }
        else {
          if (10 < bVar1) {
            uVar9 = 3;
            goto LAB_001f9b07;
          }
          bVar11 = (bVar1 & 1) == 0;
          uVar9 = (ulong)(bVar1 & 1);
        }
        if (bVar11) {
          pRtree->nBytesPerCell = bVar1 * '\x04' + '\b';
          iVar4 = getNodeSize(db,pRtree,isCreate,pzErr);
          if (iVar4 != 0) goto LAB_001f9b8a;
          iVar4 = rtreeSqlInit(pRtree,db,argv[1],argv[2],isCreate);
          if (iVar4 == 0) {
            *ppVtab = &pRtree->base;
            iVar4 = 0;
            goto LAB_001f9a7e;
          }
          pcVar5 = sqlite3_errmsg(db);
        }
        else {
          pcVar5 = local_68[uVar9];
          iVar4 = 0;
        }
        pcVar5 = sqlite3_mprintf("%s",pcVar5);
        *pzErr = pcVar5;
      }
LAB_001f9b8a:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        rtreeRelease(pRtree);
        return iVar4 + (uint)(iVar4 == 0);
      }
      goto LAB_001f9bc9;
    }
    iVar4 = 7;
  }
LAB_001f9a7e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar4;
  }
LAB_001f9bc9:
  __stack_chk_fail();
}

Assistant:

static int rtreeInit(
  sqlite3 *db,                        /* Database connection */
  void *pAux,                         /* One of the RTREE_COORD_* constants */
  int argc, const char *const*argv,   /* Parameters to CREATE TABLE statement */
  sqlite3_vtab **ppVtab,              /* OUT: New virtual table */
  char **pzErr,                       /* OUT: Error message, if any */
  int isCreate                        /* True for xCreate, false for xConnect */
){
  int rc = SQLITE_OK;
  Rtree *pRtree;
  int nDb;              /* Length of string argv[1] */
  int nName;            /* Length of string argv[2] */
  int eCoordType = (pAux ? RTREE_COORD_INT32 : RTREE_COORD_REAL32);
  sqlite3_str *pSql;
  char *zSql;
  int ii = 4;
  int iErr;

  const char *aErrMsg[] = {
    0,                                                    /* 0 */
    "Wrong number of columns for an rtree table",         /* 1 */
    "Too few columns for an rtree table",                 /* 2 */
    "Too many columns for an rtree table",                /* 3 */
    "Auxiliary rtree columns must be last"                /* 4 */
  };

  assert( RTREE_MAX_AUX_COLUMN<256 ); /* Aux columns counted by a u8 */
  if( argc<6 || argc>RTREE_MAX_AUX_COLUMN+3 ){
    *pzErr = sqlite3_mprintf("%s", aErrMsg[2 + (argc>=6)]);
    return SQLITE_ERROR;
  }

  sqlite3_vtab_config(db, SQLITE_VTAB_CONSTRAINT_SUPPORT, 1);
  sqlite3_vtab_config(db, SQLITE_VTAB_INNOCUOUS);


  /* Allocate the sqlite3_vtab structure */
  nDb = (int)strlen(argv[1]);
  nName = (int)strlen(argv[2]);
  pRtree = (Rtree *)sqlite3_malloc64(sizeof(Rtree)+nDb+nName*2+8);
  if( !pRtree ){
    return SQLITE_NOMEM;
  }
  memset(pRtree, 0, sizeof(Rtree)+nDb+nName*2+8);
  pRtree->nBusy = 1;
  pRtree->base.pModule = &rtreeModule;
  pRtree->zDb = (char *)&pRtree[1];
  pRtree->zName = &pRtree->zDb[nDb+1];
  pRtree->zNodeName = &pRtree->zName[nName+1];
  pRtree->eCoordType = (u8)eCoordType;
  memcpy(pRtree->zDb, argv[1], nDb);
  memcpy(pRtree->zName, argv[2], nName);
  memcpy(pRtree->zNodeName, argv[2], nName);
  memcpy(&pRtree->zNodeName[nName], "_node", 6);


  /* Create/Connect to the underlying relational database schema. If
  ** that is successful, call sqlite3_declare_vtab() to configure
  ** the r-tree table schema.
  */
  pSql = sqlite3_str_new(db);
  sqlite3_str_appendf(pSql, "CREATE TABLE x(%.*s INT",
                      rtreeTokenLength(argv[3]), argv[3]);
  for(ii=4; ii<argc; ii++){
    const char *zArg = argv[ii];
    if( zArg[0]=='+' ){
      pRtree->nAux++;
      sqlite3_str_appendf(pSql, ",%.*s", rtreeTokenLength(zArg+1), zArg+1);
    }else if( pRtree->nAux>0 ){
      break;
    }else{
      static const char *azFormat[] = {",%.*s REAL", ",%.*s INT"};
      pRtree->nDim2++;
      sqlite3_str_appendf(pSql, azFormat[eCoordType],
                          rtreeTokenLength(zArg), zArg);
    }
  }
  sqlite3_str_appendf(pSql, ");");
  zSql = sqlite3_str_finish(pSql);
  if( !zSql ){
    rc = SQLITE_NOMEM;
  }else if( ii<argc ){
    *pzErr = sqlite3_mprintf("%s", aErrMsg[4]);
    rc = SQLITE_ERROR;
  }else if( SQLITE_OK!=(rc = sqlite3_declare_vtab(db, zSql)) ){
    *pzErr = sqlite3_mprintf("%s", sqlite3_errmsg(db));
  }
  sqlite3_free(zSql);
  if( rc ) goto rtreeInit_fail;
  pRtree->nDim = pRtree->nDim2/2;
  if( pRtree->nDim<1 ){
    iErr = 2;
  }else if( pRtree->nDim2>RTREE_MAX_DIMENSIONS*2 ){
    iErr = 3;
  }else if( pRtree->nDim2 % 2 ){
    iErr = 1;
  }else{
    iErr = 0;
  }
  if( iErr ){
    *pzErr = sqlite3_mprintf("%s", aErrMsg[iErr]);
    goto rtreeInit_fail;
  }
  pRtree->nBytesPerCell = 8 + pRtree->nDim2*4;

  /* Figure out the node size to use. */
  rc = getNodeSize(db, pRtree, isCreate, pzErr);
  if( rc ) goto rtreeInit_fail;
  rc = rtreeSqlInit(pRtree, db, argv[1], argv[2], isCreate);
  if( rc ){
    *pzErr = sqlite3_mprintf("%s", sqlite3_errmsg(db));
    goto rtreeInit_fail;
  }

  *ppVtab = (sqlite3_vtab *)pRtree;
  return SQLITE_OK;

rtreeInit_fail:
  if( rc==SQLITE_OK ) rc = SQLITE_ERROR;
  assert( *ppVtab==0 );
  assert( pRtree->nBusy==1 );
  rtreeRelease(pRtree);
  return rc;
}